

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *this)

{
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *this_local;
  
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0012e650;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             &(this->fixedVariableHeader).super_FixedFieldGeneric,
             &(this->props).super_SerializableProperties,&(this->payload).super_SerializablePayload)
  ;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0012e650;
  FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)1,_(unsigned_char)'\x00'>::
  FixedHeaderType(&this->header);
  FixedField<(Protocol::MQTT::Common::ControlPacketType)1>::FixedField(&this->fixedVariableHeader);
  Properties::Properties(&this->props);
  Payload<(Protocol::MQTT::Common::ControlPacketType)1>::Payload(&this->payload);
  Payload<(Protocol::MQTT::Common::ControlPacketType)1>::setFlags
            (&this->payload,&(this->fixedVariableHeader).super_FixedFieldGeneric);
  FixedFieldGeneric::setFlags
            (&(this->fixedVariableHeader).super_FixedFieldGeneric,
             &(this->header).super_FixedHeaderBase.typeAndFlags);
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }